

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

void __thiscall
glslang::TIntermAggregate::setPragmaTable(TIntermAggregate *this,TPragmaTable *pTable)

{
  TPragmaTable *this_00;
  TPragmaTable *pTable_local;
  TIntermAggregate *this_local;
  
  if (this->pragmaTable == (TPragmaTable *)0x0) {
    this_00 = (TPragmaTable *)TPragmaTable::operator_new((TPragmaTable *)0x38,(size_t)pTable);
    TPragmaTable::TPragmaTable(this_00);
    this->pragmaTable = this_00;
    TPragmaTable::operator=(this->pragmaTable,pTable);
    return;
  }
  __assert_fail("pragmaTable == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Intermediate.cpp"
                ,0xe8d,"void glslang::TIntermAggregate::setPragmaTable(const TPragmaTable &)");
}

Assistant:

void TIntermAggregate::setPragmaTable(const TPragmaTable& pTable)
{
    assert(pragmaTable == nullptr);
    pragmaTable = new TPragmaTable;
    *pragmaTable = pTable;
}